

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Key.hpp
# Opt level: O0

Key<4UL> supermap::Key<4UL>::fromString(string *strKey)

{
  long lVar1;
  IllegalArgumentException *this;
  ulong uVar2;
  value_type_conflict2 *pvVar3;
  reference pvVar4;
  ulong in_RDI;
  size_t i;
  Key<4UL> arrKey;
  size_type in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  value_type_conflict2 vVar5;
  char *in_stack_ffffffffffffff88;
  ulong uVar6;
  ulong local_68;
  unsigned_long in_stack_ffffffffffffffb8;
  string local_30 [32];
  ulong local_10;
  array<unsigned_char,_4UL> local_4;
  
  local_10 = in_RDI;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 4) {
    this = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffffb8);
    std::operator+(in_stack_ffffffffffffff88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    supermap::IllegalArgumentException::IllegalArgumentException(this,local_30);
    __cxa_throw(this,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  local_68 = 0;
  while( true ) {
    uVar6 = local_68;
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= uVar6) break;
    pvVar3 = (value_type_conflict2 *)std::__cxx11::string::operator[](local_10);
    vVar5 = *pvVar3;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)CONCAT17(vVar5,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    *pvVar4 = vVar5;
    local_68 = local_68 + 1;
  }
  return (array<unsigned_char,_4UL>)(array<unsigned_char,_4UL>)local_4._M_elems;
}

Assistant:

static Key<Len> fromString(const std::string &strKey) {
        if (strKey.length() != Len) {
            throw IllegalArgumentException(
                "String key length can not be different to template size parameter, expected: " + std::to_string(Len));
        }

        Key<Len> arrKey;
        for (std::size_t i = 0; i < strKey.length(); ++i) {
            arrKey[i] = strKey[i];
        }

        return arrKey;
    }